

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O0

void __thiscall OPLio::OPLshutup(OPLio *this)

{
  uint local_14;
  uint i;
  OPLio *this_local;
  
  for (local_14 = 0; local_14 < this->OPLchannels; local_14 = local_14 + 1) {
    OPLwriteChannel(this,0x40,local_14,'?','?');
    OPLwriteChannel(this,0x60,local_14,0xff,0xff);
    OPLwriteChannel(this,0x80,local_14,'\x0f','\x0f');
    OPLwriteValue(this,0xb0,local_14,'\0');
  }
  return;
}

Assistant:

void OPLio::OPLshutup(void)
{
	uint i;

	for(i = 0; i < OPLchannels; i++)
	{
		OPLwriteChannel(0x40, i, 0x3F, 0x3F);	// turn off volume
		OPLwriteChannel(0x60, i, 0xFF, 0xFF);	// the fastest attack, decay
		OPLwriteChannel(0x80, i, 0x0F, 0x0F);	// ... and release
		OPLwriteValue(0xB0, i, 0);		// KEY-OFF
	}
}